

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

Var __thiscall
Js::JavascriptProxy::GetTypeOfString(JavascriptProxy *this,ScriptContext *requestContext)

{
  bool bVar1;
  int iVar2;
  JavascriptProxy *pJVar3;
  RecyclableObject **ppRVar4;
  JavascriptLibrary *pJVar5;
  RecyclableObject *pRVar6;
  undefined4 extraout_var;
  JavascriptProxy *proxy;
  ScriptContext *requestContext_local;
  JavascriptProxy *this_local;
  
  pJVar3 = UnwrapNestedProxies(this);
  ppRVar4 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&pJVar3->handler);
  if (*ppRVar4 == (RecyclableObject *)0x0) {
    pJVar5 = ScriptContext::GetLibrary(requestContext);
    this_local = (JavascriptProxy *)JavascriptLibrary::GetObjectTypeDisplayString(pJVar5);
  }
  else {
    ppRVar4 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->target);
    bVar1 = VarIs<Js::JavascriptFunction>(*ppRVar4);
    if (bVar1) {
      pJVar5 = ScriptContext::GetLibrary(requestContext);
      this_local = (JavascriptProxy *)JavascriptLibrary::GetFunctionTypeDisplayString(pJVar5);
    }
    else {
      pRVar6 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&pJVar3->target);
      iVar2 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x53])(pRVar6,requestContext);
      this_local = (JavascriptProxy *)CONCAT44(extraout_var,iVar2);
    }
  }
  return this_local;
}

Assistant:

Var JavascriptProxy::GetTypeOfString(ScriptContext* requestContext)
    {
        const JavascriptProxy* proxy = UnwrapNestedProxies(this);

        if (proxy->handler == nullptr)
        {
            // even if handler is nullptr, return typeof as "object"
            return requestContext->GetLibrary()->GetObjectTypeDisplayString();
        }
        // if exotic object has [[Call]] we should return "function", otherwise return "object"
        if (VarIs<JavascriptFunction>(this->target))
        {
            return requestContext->GetLibrary()->GetFunctionTypeDisplayString();
        }
        else
        {
            // handle nested cases recursively
            return proxy->target->GetTypeOfString(requestContext);
        }
    }